

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

void __thiscall
Inline::WrapArgsOutWithCoerse(Inline *this,BuiltinFunction builtInId,Instr *callInstr)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  StackSym *pSVar3;
  Instr *pIVar4;
  Func *pFVar5;
  code *pcVar6;
  bool bVar7;
  OpndKind OVar8;
  byte bVar9;
  ArgSlot AVar10;
  undefined4 *puVar11;
  Instr *pIVar12;
  intptr_t iVar13;
  AddrOpnd *pAVar14;
  uint uVar15;
  Opnd *pOVar16;
  int iVar17;
  
  if (builtInId._value == '@') {
    if (callInstr->m_opcode != CallDirect) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1a6,"(this->m_opcode == Js::OpCode::CallDirect)",
                         "this->m_opcode == Js::OpCode::CallDirect");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pOVar16 = callInstr->m_src2;
    OVar8 = IR::Opnd::GetKind(pOVar16);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pp_Var1 = pOVar16[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    p_Var2 = pp_Var1[5];
    if (*(short *)(p_Var2 + 0x30) != 0x1ef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1ad,"(tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                         "tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pOVar16 = *(Opnd **)(p_Var2 + 0x50);
    OVar8 = IR::Opnd::GetKind(pOVar16);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pSVar3 = (StackSym *)pOVar16[1]._vptr_Opnd;
    if ((pSVar3->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar7) {
LAB_00556a99:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar11 = 0;
    }
    AVar10 = StackSym::GetArgSlotNum(pSVar3);
    if ((AVar10 == 2) && (OVar8 = IR::Opnd::GetKind(pOVar16), OVar8 == OpndKindSym)) {
      iVar17 = -1;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        OVar8 = IR::Opnd::GetKind(pOVar16);
        if (OVar8 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        pp_Var1 = pOVar16[1]._vptr_Opnd;
        if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        if (((ulong)pp_Var1[3] & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1bc,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        pIVar4 = (Instr *)pp_Var1[5];
        if (pIVar4->m_opcode != ArgOut_A) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1be,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                             "argInstr->m_opcode == Js::OpCode::ArgOut_A");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        if (iVar17 == 0) {
          pIVar12 = IR::Instr::HoistSrc1(pIVar4,Coerce_Regex,RegNOREG,(StackSym *)0x0);
        }
        else {
          pIVar12 = IR::Instr::HoistSrc1(pIVar4,Conv_Str,RegNOREG,(StackSym *)0x0);
          IR::Opnd::SetValueType(pIVar12->m_dst,(ValueType)0x800);
          IR::Opnd::SetValueType(pIVar4->m_src1,(ValueType)0x800);
        }
        IR::Instr::SetByteCodeOffset(pIVar12,pIVar4);
        pIVar12->field_0x37 = pIVar12->field_0x37 | 2;
        pOVar16 = pIVar4->m_src2;
        OVar8 = IR::Opnd::GetKind(pOVar16);
      } while ((iVar17 != 0) && (iVar17 = iVar17 + 1, OVar8 == OpndKindSym));
    }
  }
  else if (builtInId._value == '\x11') {
    if (callInstr->m_opcode != CallDirect) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1a6,"(this->m_opcode == Js::OpCode::CallDirect)",
                         "this->m_opcode == Js::OpCode::CallDirect");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pOVar16 = callInstr->m_src2;
    OVar8 = IR::Opnd::GetKind(pOVar16);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pp_Var1 = pOVar16[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    p_Var2 = pp_Var1[5];
    if (*(short *)(p_Var2 + 0x30) != 0x1ef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1ad,"(tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                         "tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pOVar16 = *(Opnd **)(p_Var2 + 0x50);
    OVar8 = IR::Opnd::GetKind(pOVar16);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pSVar3 = (StackSym *)pOVar16[1]._vptr_Opnd;
    if ((pSVar3->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    AVar10 = StackSym::GetArgSlotNum(pSVar3);
    if ((AVar10 == 3) && (OVar8 = IR::Opnd::GetKind(pOVar16), OVar8 == OpndKindSym)) {
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      uVar15 = 2;
      do {
        OVar8 = IR::Opnd::GetKind(pOVar16);
        if (OVar8 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        pp_Var1 = pOVar16[1]._vptr_Opnd;
        if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        if (((ulong)pp_Var1[3] & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1bc,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        pIVar4 = (Instr *)pp_Var1[5];
        if (pIVar4->m_opcode != ArgOut_A) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1be,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                             "argInstr->m_opcode == Js::OpCode::ArgOut_A");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        if (uVar15 == 0) {
          pIVar12 = IR::Instr::HoistSrc1(pIVar4,Coerce_Str,RegNOREG,(StackSym *)0x0);
          IR::Opnd::SetValueType(pIVar12->m_dst,(ValueType)0x800);
          iVar13 = ThreadContextInfo::GetStringReplaceNameAddr(pIVar12->m_func->m_threadContextInfo)
          ;
          pAVar14 = IR::AddrOpnd::New(iVar13,AddrOpndKindSz,pIVar12->m_func,false,(Var)0x0);
          if (pIVar12->m_src2 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar7) goto LAB_00556a99;
            *puVar11 = 0;
          }
          pFVar5 = pIVar12->m_func;
          if ((pAVar14->super_Opnd).isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar7) goto LAB_00556a99;
            *puVar11 = 0;
          }
          bVar9 = (pAVar14->super_Opnd).field_0xb;
          if ((bVar9 & 2) != 0) {
            pAVar14 = (AddrOpnd *)IR::Opnd::Copy(&pAVar14->super_Opnd,pFVar5);
            bVar9 = (pAVar14->super_Opnd).field_0xb;
          }
          (pAVar14->super_Opnd).field_0xb = bVar9 | 2;
          pIVar12->m_src2 = &pAVar14->super_Opnd;
          IR::Opnd::SetValueType(pIVar4->m_src1,(ValueType)0x800);
        }
        else {
          pIVar12 = (Instr *)0x0;
        }
        if (uVar15 == 1) {
          pIVar12 = IR::Instr::HoistSrc1(pIVar4,Coerce_StrOrRegex,RegNOREG,(StackSym *)0x0);
        }
        if (uVar15 < 2) {
          IR::Instr::SetByteCodeOffset(pIVar12,pIVar4);
          pIVar12->field_0x37 = pIVar12->field_0x37 | 2;
        }
        pOVar16 = pIVar4->m_src2;
        OVar8 = IR::Opnd::GetKind(pOVar16);
      } while ((uVar15 != 0) && (uVar15 = uVar15 - 1, OVar8 == OpndKindSym));
    }
  }
  else if (builtInId._value == '\x10') {
    if (callInstr->m_opcode != CallDirect) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1a6,"(this->m_opcode == Js::OpCode::CallDirect)",
                         "this->m_opcode == Js::OpCode::CallDirect");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pOVar16 = callInstr->m_src2;
    OVar8 = IR::Opnd::GetKind(pOVar16);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pp_Var1 = pOVar16[1]._vptr_Opnd;
    if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    p_Var2 = pp_Var1[5];
    if (*(short *)(p_Var2 + 0x30) != 0x1ef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x1ad,"(tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)",
                         "tmpInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pOVar16 = *(Opnd **)(p_Var2 + 0x50);
    OVar8 = IR::Opnd::GetKind(pOVar16);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    pSVar3 = (StackSym *)pOVar16[1]._vptr_Opnd;
    if ((pSVar3->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar11 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar7) goto LAB_00556a99;
      *puVar11 = 0;
    }
    AVar10 = StackSym::GetArgSlotNum(pSVar3);
    if ((AVar10 == 2) && (OVar8 = IR::Opnd::GetKind(pOVar16), OVar8 == OpndKindSym)) {
      iVar17 = -1;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        OVar8 = IR::Opnd::GetKind(pOVar16);
        if (OVar8 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        pp_Var1 = pOVar16[1]._vptr_Opnd;
        if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                             ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        if (((ulong)pp_Var1[3] & 1) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1bc,"(sym->m_isSingleDef)","sym->m_isSingleDef");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        pIVar4 = (Instr *)pp_Var1[5];
        if (pIVar4->m_opcode != ArgOut_A) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x1be,"(argInstr->m_opcode == Js::OpCode::ArgOut_A)",
                             "argInstr->m_opcode == Js::OpCode::ArgOut_A");
          if (!bVar7) goto LAB_00556a99;
          *puVar11 = 0;
        }
        if (iVar17 == 0) {
          pIVar12 = IR::Instr::HoistSrc1(pIVar4,Coerce_Str,RegNOREG,(StackSym *)0x0);
          IR::Opnd::SetValueType(pIVar12->m_dst,(ValueType)0x800);
          iVar13 = ThreadContextInfo::GetStringMatchNameAddr(pIVar12->m_func->m_threadContextInfo);
          pAVar14 = IR::AddrOpnd::New(iVar13,AddrOpndKindSz,pIVar12->m_func,false,(Var)0x0);
          if (pIVar12->m_src2 != (Opnd *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src."
                              );
            if (!bVar7) goto LAB_00556a99;
            *puVar11 = 0;
          }
          pFVar5 = pIVar12->m_func;
          if ((pAVar14->super_Opnd).isDeleted == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar11 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x14,"(!isDeleted)","Using deleted operand");
            if (!bVar7) goto LAB_00556a99;
            *puVar11 = 0;
          }
          bVar9 = (pAVar14->super_Opnd).field_0xb;
          if ((bVar9 & 2) != 0) {
            pAVar14 = (AddrOpnd *)IR::Opnd::Copy(&pAVar14->super_Opnd,pFVar5);
            bVar9 = (pAVar14->super_Opnd).field_0xb;
          }
          (pAVar14->super_Opnd).field_0xb = bVar9 | 2;
          pIVar12->m_src2 = &pAVar14->super_Opnd;
          IR::Opnd::SetValueType(pIVar4->m_src1,(ValueType)0x800);
        }
        else {
          pIVar12 = IR::Instr::HoistSrc1(pIVar4,Coerce_Regex,RegNOREG,(StackSym *)0x0);
        }
        IR::Instr::SetByteCodeOffset(pIVar12,pIVar4);
        pIVar12->field_0x37 = pIVar12->field_0x37 | 2;
        pOVar16 = pIVar4->m_src2;
        OVar8 = IR::Opnd::GetKind(pOVar16);
      } while ((iVar17 != 0) && (iVar17 = iVar17 + 1, OVar8 == OpndKindSym));
    }
  }
  return;
}

Assistant:

void
Inline::WrapArgsOutWithCoerse(Js::BuiltinFunction builtInId, IR::Instr* callInstr)
{
    switch (builtInId)
    {
    case Js::BuiltinFunction::JavascriptString_Match:
        callInstr->ForEachCallDirectArgOutInstrBackward([&](IR::Instr *argOutInstr, uint argNum)
        {
            IR::Instr * newInstr = nullptr;
            bool isPreOpBailOutNeeded = false;
            if (argNum == 0)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_Str);
                isPreOpBailOutNeeded = true;
                newInstr->GetDst()->SetValueType(ValueType::String);
                newInstr->SetSrc2(IR::AddrOpnd::New(newInstr->m_func->GetThreadContextInfo()->GetStringMatchNameAddr(), IR::AddrOpndKindSz, newInstr->m_func));
                argOutInstr->GetSrc1()->SetValueType(ValueType::String);
            }
            else if (argNum == 1)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_Regex);
                isPreOpBailOutNeeded = true;
            }
            if (isPreOpBailOutNeeded)
            {
                newInstr->SetByteCodeOffset(argOutInstr);
                newInstr->forcePreOpBailOutIfNeeded = true;
            }
            return false;
        }, 2);
        break;

    case Js::BuiltinFunction::JavascriptString_Replace:
        callInstr->ForEachCallDirectArgOutInstrBackward([&](IR::Instr *argOutInstr, uint argNum)
        {
            IR::Instr * newInstr = nullptr;
            bool isPreOpBailOutNeeded = false;
            if (argNum == 0)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_Str);
                isPreOpBailOutNeeded = true;
                newInstr->GetDst()->SetValueType(ValueType::String);
                newInstr->SetSrc2(IR::AddrOpnd::New(newInstr->m_func->GetThreadContextInfo()->GetStringReplaceNameAddr(), IR::AddrOpndKindSz, newInstr->m_func));
                argOutInstr->GetSrc1()->SetValueType(ValueType::String);
            }
            if (argNum == 1)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_StrOrRegex);
                isPreOpBailOutNeeded = true;
            }
            if (isPreOpBailOutNeeded)
            {
                newInstr->SetByteCodeOffset(argOutInstr);
                newInstr->forcePreOpBailOutIfNeeded = true;
            }
            return false;
        }, 3);
        break;
    case Js::BuiltinFunction::JavascriptRegExp_Exec:
        callInstr->ForEachCallDirectArgOutInstrBackward([&](IR::Instr *argOutInstr, uint argNum)
        {
            IR::Instr * newInstr = nullptr;
            bool isPreOpBailOutNeeded = false;
            if (argNum == 0)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Coerce_Regex);
                isPreOpBailOutNeeded = true;
            }
            else if (argNum == 1)
            {
                newInstr = argOutInstr->HoistSrc1(Js::OpCode::Conv_Str);
                newInstr->GetDst()->SetValueType(ValueType::String);
                argOutInstr->GetSrc1()->SetValueType(ValueType::String);
                isPreOpBailOutNeeded = true;
            }
            if (isPreOpBailOutNeeded)
            {
                newInstr->SetByteCodeOffset(argOutInstr);
                newInstr->forcePreOpBailOutIfNeeded = true;
            }
            return false;
        }, 2);
        break;
    }
}